

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_unicode_sets.cpp
# Opt level: O3

UBool anon_unknown.dwarf_29e7b0::cleanupNumberParseUniSets(void)

{
  UnicodeSet *this;
  void *in_RSI;
  long lVar1;
  
  if ((anonymous_namespace)::gEmptyUnicodeSetInitialized != '\0') {
    icu_63::UnicodeSet::~UnicodeSet((UnicodeSet *)(anonymous_namespace)::gEmptyUnicodeSet);
    (anonymous_namespace)::gEmptyUnicodeSetInitialized = '\0';
  }
  lVar1 = 0;
  do {
    this = *(UnicodeSet **)((long)&(anonymous_namespace)::gUnicodeSets + lVar1);
    if (this != (UnicodeSet *)0x0) {
      icu_63::UnicodeSet::~UnicodeSet(this);
    }
    icu_63::UMemory::operator_delete((UMemory *)this,in_RSI);
    *(undefined8 *)((long)&(anonymous_namespace)::gUnicodeSets + lVar1) = 0;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0xb0);
  LOCK();
  (anonymous_namespace)::gNumberParseUniSetsInitOnce = 0;
  UNLOCK();
  return '\x01';
}

Assistant:

UBool U_CALLCONV cleanupNumberParseUniSets() {
    if (gEmptyUnicodeSetInitialized) {
        reinterpret_cast<UnicodeSet*>(gEmptyUnicodeSet)->~UnicodeSet();
        gEmptyUnicodeSetInitialized = FALSE;
    }
    for (int32_t i = 0; i < COUNT; i++) {
        delete gUnicodeSets[i];
        gUnicodeSets[i] = nullptr;
    }
    gNumberParseUniSetsInitOnce.reset();
    return TRUE;
}